

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canonical_encoders.cc
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
hanabi_learning_env::CanonicalObservationEncoder::Encode
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          CanonicalObservationEncoder *this,HanabiObservation *obs)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Type TVar5;
  HanabiGame *pHVar6;
  pointer pHVar7;
  pointer pHVar8;
  pointer pHVar9;
  HanabiCard *card;
  pointer piVar10;
  pointer pHVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  pointer *ppHVar15;
  pointer pHVar16;
  ulong uVar17;
  int *piVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  byte bVar22;
  int r;
  int iVar23;
  int iVar24;
  ulong uVar25;
  char *__assertion;
  uint uVar26;
  long lVar27;
  int iVar28;
  HanabiObservation *pHVar29;
  pointer this_00;
  uint uVar30;
  ulong uVar31;
  int iVar32;
  int color;
  bool bVar33;
  long lStack_d0;
  allocator_type local_c1;
  vector<int,_std::allocator<int>_> *local_c0;
  ulong local_b8;
  HanabiObservation *local_b0;
  uint local_a4;
  ulong local_a0;
  ulong local_98;
  HanabiGame *local_90;
  ulong local_88;
  pointer local_80;
  ulong local_78;
  int local_70;
  value_type_conflict local_6c;
  vector<int,_std::allocator<int>_> discard_counts;
  
  local_c0 = __return_storage_ptr__;
  local_b0 = obs;
  (*(this->super_ObservationEncoder)._vptr_ObservationEncoder[2])(&discard_counts);
  iVar13 = 1;
  for (piVar10 = discard_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      piVar10 !=
      discard_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish; piVar10 = piVar10 + 1) {
    iVar13 = iVar13 * *piVar10;
  }
  local_6c = 0;
  std::vector<int,_std::allocator<int>_>::vector(local_c0,(long)iVar13,&local_6c,&local_c1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&discard_counts.super__Vector_base<int,_std::allocator<int>_>);
  pHVar29 = local_b0;
  pHVar6 = this->parent_game_;
  uVar26 = pHVar6->num_players_;
  local_b8 = (ulong)(int)uVar26;
  pHVar7 = (local_b0->hands_).
           super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_98 = ((long)(local_b0->hands_).
                    super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar7) / 0x30;
  local_80 = (pointer)this;
  if (local_98 != local_b8) {
    __assertion = "hands.size() == num_players";
    uVar26 = 0x48;
LAB_0011b269:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/canonical_encoders.cc"
                  ,uVar26,
                  "int hanabi_learning_env::(anonymous namespace)::EncodeHands(const HanabiGame &, const HanabiObservation &, int, std::vector<int> *)"
                 );
  }
  iVar13 = pHVar6->num_ranks_;
  iVar24 = pHVar6->num_colors_ * iVar13;
  iVar21 = pHVar6->hand_size_;
  iVar32 = 0;
  for (lVar27 = 1; lVar27 < (long)local_98; lVar27 = lVar27 + 1) {
    pHVar8 = pHVar7[lVar27].cards_.
             super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    piVar10 = (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    iVar23 = 0;
    iVar28 = iVar24 * iVar21;
    for (pHVar11 = *(pointer *)
                    &pHVar7[lVar27].cards_.
                     super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                     ._M_impl; pHVar11 != pHVar8; pHVar11 = pHVar11 + 1) {
      iVar2 = pHVar11->color_;
      if ((iVar2 < 0) || (iVar3 = pHVar11->rank_, iVar3 < 0)) {
        __assertion = "card.IsValid()";
        uVar26 = 0x4f;
        goto LAB_0011b269;
      }
      if (pHVar6->num_colors_ <= iVar2) {
        __assertion = "card.Color() < game.NumColors()";
        uVar26 = 0x50;
        goto LAB_0011b269;
      }
      if (iVar13 <= iVar3) {
        __assertion = "card.Rank() < num_ranks";
        uVar26 = 0x51;
        goto LAB_0011b269;
      }
      piVar10[iVar3 + iVar32 + iVar2 * iVar13] = 1;
      iVar23 = iVar23 + 1;
      iVar32 = iVar32 + iVar24;
      iVar28 = iVar28 - iVar24;
    }
    if (iVar21 <= iVar23) {
      iVar28 = 0;
    }
    iVar32 = iVar32 + iVar28;
  }
  uVar17 = 0;
  uVar25 = 0;
  if (0 < (int)uVar26) {
    uVar25 = (ulong)uVar26;
  }
  piVar10 = (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppHVar15 = &(pHVar7->cards_).
              super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  for (; uVar25 != uVar17; uVar17 = uVar17 + 1) {
    if ((ulong)((long)*ppHVar15 - (long)((_Vector_impl_data *)(ppHVar15 + -1))->_M_start >> 3) <
        (ulong)(long)pHVar6->hand_size_) {
      piVar10[(long)iVar32 + uVar17] = 1;
    }
    ppHVar15 = ppHVar15 + 6;
  }
  iVar21 = iVar32 + uVar26;
  iVar13 = anon_unknown_4::HandsSectionLength(pHVar6);
  if (iVar21 != iVar13) {
    __assertion = "offset - start_offset == HandsSectionLength(game)";
    uVar26 = 0x68;
    goto LAB_0011b269;
  }
  uVar26 = pHVar6->num_colors_;
  iVar13 = pHVar6->num_players_;
  iVar24 = pHVar6->num_ranks_;
  iVar28 = pHVar6->hand_size_;
  iVar23 = pHVar6->cards_per_color_;
  piVar10 = (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  for (lVar27 = 0; lVar27 < pHVar29->deck_size_; lVar27 = lVar27 + 1) {
    piVar10[iVar21 + lVar27] = 1;
  }
  uVar30 = iVar23 * uVar26;
  iVar28 = iVar28 * iVar13;
  piVar18 = (pHVar29->fireworks_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar17 = 0;
  if (0 < (int)uVar26) {
    uVar17 = (ulong)uVar26;
  }
  piVar10 = (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar27 = (long)(int)((iVar21 - iVar28) + uVar30) << 2;
  uVar26 = ((int)local_b8 - iVar28) + iVar32;
  while( true ) {
    bVar33 = uVar17 == 0;
    uVar17 = uVar17 - 1;
    if (bVar33) break;
    if (0 < *piVar18) {
      piVar10[(long)(int)(*piVar18 + uVar30 + uVar26) + -1] = 1;
    }
    lVar27 = lVar27 + (long)iVar24 * 4;
    piVar18 = piVar18 + 1;
    uVar26 = uVar26 + iVar24;
    iVar28 = iVar28 - iVar24;
  }
  iVar13 = pHVar29->information_tokens_;
  if (iVar13 < 0) {
    __assert_fail("obs.InformationTokens() >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/canonical_encoders.cc"
                  ,0x97,
                  "int hanabi_learning_env::(anonymous namespace)::EncodeBoard(const HanabiGame &, const HanabiObservation &, int, std::vector<int> *)"
                 );
  }
  if (pHVar6->max_information_tokens_ < iVar13) {
    __assert_fail("obs.InformationTokens() <= game.MaxInformationTokens()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/canonical_encoders.cc"
                  ,0x98,
                  "int hanabi_learning_env::(anonymous namespace)::EncodeBoard(const HanabiGame &, const HanabiObservation &, int, std::vector<int> *)"
                 );
  }
  piVar10 = (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  for (lVar19 = 0; lVar19 < iVar13; lVar19 = lVar19 + 1) {
    *(undefined4 *)((long)piVar10 + lVar19 * 4 + lVar27) = 1;
    iVar13 = pHVar29->information_tokens_;
  }
  iVar13 = pHVar29->life_tokens_;
  if (iVar13 < 0) {
    __assert_fail("obs.LifeTokens() >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/canonical_encoders.cc"
                  ,0x9f,
                  "int hanabi_learning_env::(anonymous namespace)::EncodeBoard(const HanabiGame &, const HanabiObservation &, int, std::vector<int> *)"
                 );
  }
  if (pHVar6->max_life_tokens_ < iVar13) {
    __assert_fail("obs.LifeTokens() <= game.MaxLifeTokens()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/canonical_encoders.cc"
                  ,0xa0,
                  "int hanabi_learning_env::(anonymous namespace)::EncodeBoard(const HanabiGame &, const HanabiObservation &, int, std::vector<int> *)"
                 );
  }
  uVar14 = pHVar6->max_information_tokens_;
  local_a0 = (ulong)uVar14;
  piVar10 = (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  for (lVar27 = 0; lVar27 < iVar13; lVar27 = lVar27 + 1) {
    piVar10[(int)(uVar14 + uVar30 + uVar26) + lVar27] = 1;
    iVar13 = pHVar29->life_tokens_;
  }
  iVar13 = pHVar6->max_life_tokens_;
  iVar21 = anon_unknown_4::BoardSectionLength(pHVar6);
  uVar14 = (int)local_a0 + iVar13;
  local_a0 = (ulong)uVar14;
  if ((uVar14 - iVar21) + uVar30 != iVar28) {
    __assert_fail("offset - start_offset == BoardSectionLength(game)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/canonical_encoders.cc"
                  ,0xa6,
                  "int hanabi_learning_env::(anonymous namespace)::EncodeBoard(const HanabiGame &, const HanabiObservation &, int, std::vector<int> *)"
                 );
  }
  uVar14 = pHVar6->num_colors_;
  uVar4 = pHVar6->num_ranks_;
  uVar17 = (ulong)(int)uVar4;
  local_6c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&discard_counts,uVar17 * (long)(int)uVar14,&local_6c,&local_c1);
  iVar13 = uVar26 + uVar30 + (int)local_a0;
  pHVar8 = (pHVar29->discard_pile_).
           super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pHVar11 = (pHVar29->discard_pile_).
                 super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                 ._M_impl.super__Vector_impl_data._M_start; pHVar11 != pHVar8; pHVar11 = pHVar11 + 1
      ) {
    discard_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[(long)pHVar11->rank_ + (long)pHVar11->color_ * uVar17] =
         discard_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[(long)pHVar11->rank_ + (long)pHVar11->color_ * uVar17] + 1
    ;
  }
  uVar25 = 0;
  if (0 < (int)uVar4) {
    uVar25 = (ulong)uVar4;
  }
  local_98 = (ulong)uVar14;
  if ((int)uVar14 < 1) {
    local_98 = 0;
  }
  local_b8 = (ulong)uVar26;
  local_88 = (ulong)uVar30;
  local_78 = uVar17;
  for (uVar31 = 0; uVar31 != local_98; uVar31 = uVar31 + 1) {
    lVar27 = uVar31 * local_78;
    for (uVar17 = 0; uVar17 != uVar25; uVar17 = uVar17 + 1) {
      uVar12 = (ulong)(uint)discard_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar17 + lVar27];
      if (discard_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar17 + lVar27] < 1) {
        uVar12 = 0;
      }
      piVar10 = (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      for (uVar20 = 0; uVar12 != uVar20; uVar20 = uVar20 + 1) {
        piVar10[(long)iVar13 + uVar20] = 1;
      }
      iVar21 = HanabiGame::NumberCardInstances(pHVar6,(int)uVar31,(int)uVar17);
      iVar13 = iVar13 + iVar21;
    }
  }
  if ((int)local_88 + (((int)local_a0 + pHVar6->num_colors_ * pHVar6->cards_per_color_) - iVar13) +
      (int)local_b8 != 0) {
    __assert_fail("offset - start_offset == DiscardSectionLength(game)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/canonical_encoders.cc"
                  ,0xd2,
                  "int hanabi_learning_env::(anonymous namespace)::EncodeDiscards(const HanabiGame &, const HanabiObservation &, int, std::vector<int> *)"
                 );
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&discard_counts.super__Vector_base<int,_std::allocator<int>_>);
  pHVar29 = local_b0;
  pHVar6 = *(HanabiGame **)
            &(local_80->color_).value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data;
  iVar21 = pHVar6->num_colors_;
  iVar24 = pHVar6->num_ranks_;
  iVar32 = pHVar6->num_players_;
  uVar26 = pHVar6->hand_size_;
  pHVar16 = (local_b0->last_moves_).
            super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pHVar9 = (local_b0->last_moves_).
           super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar27 = (long)pHVar9 - (long)pHVar16;
  for (lVar19 = lVar27 >> 6; local_90 = pHVar6, 0 < lVar19; lVar19 = lVar19 + -1) {
    if ((pHVar16->move).move_type_ != kDeal) goto LAB_0011ae1e;
    if (pHVar16[1].move.move_type_ != kDeal) {
      pHVar16 = pHVar16 + 1;
      goto LAB_0011ae1e;
    }
    if (pHVar16[2].move.move_type_ != kDeal) {
      pHVar16 = pHVar16 + 2;
      goto LAB_0011ae1e;
    }
    if (pHVar16[3].move.move_type_ != kDeal) {
      pHVar16 = pHVar16 + 3;
      goto LAB_0011ae1e;
    }
    pHVar16 = pHVar16 + 4;
    lVar27 = lVar27 + -0x40;
  }
  lVar27 = lVar27 >> 4;
  if (lVar27 != 1) {
    if (lVar27 == 2) {
LAB_0011adfc:
      if ((pHVar16->move).move_type_ == kDeal) {
        pHVar16 = pHVar16 + 1;
        goto LAB_0011ae05;
      }
      goto LAB_0011ae1e;
    }
    if (lVar27 == 3) {
      if ((pHVar16->move).move_type_ == kDeal) {
        pHVar16 = pHVar16 + 1;
        goto LAB_0011adfc;
      }
      goto LAB_0011ae1e;
    }
LAB_0011ae2e:
    iVar21 = anon_unknown_4::LastActionSectionLength(pHVar6);
    local_a4 = iVar21 + iVar13;
    goto LAB_0011afd3;
  }
LAB_0011ae05:
  if ((pHVar16->move).move_type_ == kDeal) {
    pHVar16 = pHVar9;
  }
LAB_0011ae1e:
  if (pHVar16 == pHVar9 || pHVar16 == (pointer)0x0) goto LAB_0011ae2e;
  TVar5 = (pHVar16->move).move_type_;
  cVar1 = pHVar16->player;
  piVar10 = (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar10[iVar13 + cVar1] = 1;
  uVar30 = TVar5 - kPlay;
  if (3 < uVar30) {
    abort();
  }
  iVar28 = iVar32 + iVar13;
  lVar27 = (long)iVar28;
  switch(uVar30) {
  case 0:
    break;
  case 1:
    lVar27 = lVar27 + 1;
    break;
  case 2:
    lStack_d0 = 8;
    goto LAB_0011ae95;
  case 3:
    lStack_d0 = 0xc;
LAB_0011ae95:
    bVar22 = 1;
    *(undefined4 *)((long)piVar10 + lStack_d0 + lVar27 * 4) = 1;
    piVar10[(char)(((int)(pHVar16->move).target_offset_ + (int)cVar1) % iVar32) + iVar28 + 4] = 1;
    iVar32 = iVar28 + iVar32 + 4;
    if (TVar5 == kRevealColor) {
      piVar10[(long)iVar32 + (long)(pHVar16->move).color_] = 1;
    }
    else {
      piVar10[(long)(iVar32 + iVar21) + (long)(pHVar16->move).rank_] = 1;
    }
    iVar21 = iVar21 + iVar32 + iVar24;
    uVar17 = 0;
    uVar25 = 0;
    if (0 < (int)uVar26) {
      uVar25 = (ulong)uVar26;
    }
    for (; uVar25 != uVar17; uVar17 = uVar17 + 1) {
      if ((bVar22 & pHVar16->reveal_bitmask) != 0) {
        piVar10[(long)iVar21 + uVar17] = 1;
      }
      bVar22 = bVar22 * '\x02';
    }
    goto LAB_0011af49;
  }
  piVar10[lVar27] = 1;
  iVar21 = iVar21 + iVar24 + iVar32 + iVar28 + 4;
LAB_0011af49:
  iVar21 = iVar21 + uVar26;
  if (uVar30 < 2) {
    piVar10[(long)iVar21 + (long)(pHVar16->move).card_index_] = 1;
    if (pHVar16->color < '\0') {
      __assert_fail("last_move->color >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/canonical_encoders.cc"
                    ,0x13e,
                    "int hanabi_learning_env::(anonymous namespace)::EncodeLastAction(const HanabiGame &, const HanabiObservation &, int, std::vector<int> *)"
                   );
    }
    if (pHVar16->rank < '\0') {
      __assert_fail("last_move->rank >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/canonical_encoders.cc"
                    ,0x13f,
                    "int hanabi_learning_env::(anonymous namespace)::EncodeLastAction(const HanabiGame &, const HanabiObservation &, int, std::vector<int> *)"
                   );
    }
    piVar10[(int)((int)pHVar16->rank + iVar21 + uVar26 + iVar24 * pHVar16->color)] = 1;
  }
  iVar21 = pHVar6->num_ranks_ * pHVar6->num_colors_ + iVar21 + uVar26;
  if (TVar5 == kPlay) {
    if (pHVar16->scored == true) {
      piVar10[iVar21] = 1;
    }
    if (pHVar16->information_token == true) {
      piVar10[(long)iVar21 + 1] = 1;
    }
  }
  local_a4 = iVar21 + 2;
LAB_0011afd3:
  iVar13 = local_a4 - iVar13;
  iVar21 = anon_unknown_4::LastActionSectionLength(pHVar6);
  if (iVar13 != iVar21) {
    __assert_fail("offset - start_offset == LastActionSectionLength(game)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/canonical_encoders.cc"
                  ,0x151,
                  "int hanabi_learning_env::(anonymous namespace)::EncodeLastAction(const HanabiGame &, const HanabiObservation &, int, std::vector<int> *)"
                 );
  }
  uVar26 = local_a4;
  if (pHVar6->observation_type_ != kMinimal) {
    uVar30 = pHVar6->num_players_;
    if (((long)(pHVar29->hands_).
               super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pHVar29->hands_).
              super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x30 != (long)(int)uVar30) {
      __assert_fail("hands.size() == num_players",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/canonical_encoders.cc"
                    ,0x179,
                    "int hanabi_learning_env::(anonymous namespace)::EncodeCardKnowledge(const HanabiGame &, const HanabiObservation &, int, std::vector<int> *)"
                   );
    }
    iVar13 = pHVar6->num_colors_;
    uVar14 = pHVar6->num_ranks_;
    local_78 = (ulong)uVar14;
    local_70 = pHVar6->hand_size_;
    local_88 = (ulong)(uVar14 + iVar13 + uVar14 * iVar13);
    uVar17 = 0;
    if (0 < (int)uVar14) {
      uVar17 = (ulong)uVar14;
    }
    iVar21 = 0;
    if (0 < iVar13) {
      iVar21 = iVar13;
    }
    local_98 = CONCAT44(local_98._4_4_,iVar21);
    if ((int)uVar30 < 1) {
      uVar30 = 0;
    }
    for (uVar25 = 0; uVar25 != uVar30; uVar25 = uVar25 + 1) {
      pHVar7 = (pHVar29->hands_).
               super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_80 = pHVar7[uVar25].card_knowledge_.
                 super__Vector_base<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_b8 = (ulong)uVar26;
      iVar21 = 0;
      for (this_00 = pHVar7[uVar25].card_knowledge_.
                     super__Vector_base<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_00 != local_80;
          this_00 = this_00 + 1) {
        local_a0 = CONCAT44(local_a0._4_4_,iVar21);
        uVar31 = local_b8;
        for (iVar21 = 0; iVar21 != (int)local_98; iVar21 = iVar21 + 1) {
          bVar33 = HanabiHand::ValueKnowledge::IsPlausible(&this_00->color_,iVar21);
          if (bVar33) {
            for (uVar12 = 0; uVar17 != uVar12; uVar12 = uVar12 + 1) {
              bVar33 = HanabiHand::ValueKnowledge::IsPlausible(&this_00->rank_,(int)uVar12);
              if (bVar33) {
                (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)uVar31 + (int)uVar12] = 1;
              }
            }
          }
          uVar31 = uVar31 + local_78;
        }
        iVar24 = uVar14 * iVar13 + (int)local_b8;
        iVar21 = (this_00->color_).value_;
        if (-1 < iVar21) {
          (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[iVar21 + iVar24] = 1;
        }
        iVar21 = (this_00->rank_).value_;
        if (-1 < iVar21) {
          (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[iVar21 + iVar24 + iVar13] = 1;
        }
        local_b8 = local_b8 + local_88;
        iVar21 = (int)local_a0 + 1;
      }
      iVar24 = (local_70 - iVar21) * (int)local_88;
      if (local_70 <= iVar21) {
        iVar24 = 0;
      }
      uVar26 = iVar24 + (int)local_b8;
      pHVar29 = local_b0;
    }
    iVar21 = uVar26 - local_a4;
    iVar13 = anon_unknown_4::CardKnowledgeSectionLength(local_90);
    if (iVar21 != iVar13) {
      __assert_fail("offset - start_offset == CardKnowledgeSectionLength(game)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/canonical_encoders.cc"
                    ,0x1a2,
                    "int hanabi_learning_env::(anonymous namespace)::EncodeCardKnowledge(const HanabiGame &, const HanabiObservation &, int, std::vector<int> *)"
                   );
    }
  }
  if ((long)(local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2 == (long)(int)uVar26) {
    return local_c0;
  }
  __assert_fail("offset == encoding.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/canonical_encoders.cc"
                ,0x1c2,
                "virtual std::vector<int> hanabi_learning_env::CanonicalObservationEncoder::Encode(const HanabiObservation &) const"
               );
}

Assistant:

std::vector<int> CanonicalObservationEncoder::Encode(
    const HanabiObservation& obs) const {
  // Make an empty bit string of the proper size.
  std::vector<int> encoding(FlatLength(Shape()), 0);

  // This offset is an index to the start of each section of the bit vector.
  // It is incremented at the end of each section.
  int offset = 0;
  offset += EncodeHands(*parent_game_, obs, offset, &encoding);
  offset += EncodeBoard(*parent_game_, obs, offset, &encoding);
  offset += EncodeDiscards(*parent_game_, obs, offset, &encoding);
  offset += EncodeLastAction(*parent_game_, obs, offset, &encoding);
  if (parent_game_->ObservationType() != HanabiGame::kMinimal) {
    offset += EncodeCardKnowledge(*parent_game_, obs, offset, &encoding);
  }

  assert(offset == encoding.size());
  return encoding;
}